

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Klex.cpp
# Opt level: O0

void __thiscall Klex::Klex(Klex *this,char *filepath)

{
  FILE *pFVar1;
  undefined8 *puVar2;
  char *filepath_local;
  Klex *this_local;
  
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>_>
  ::unordered_map(&this->lexToTokenTable);
  this->currentChar = 0;
  this->charClass = OTHER;
  this->tokenType = Unknown;
  std::__cxx11::string::string((string *)&this->lexeme);
  this->lineNum = 1;
  this->colNum = 0;
  this->isSimpleString = false;
  this->isInterpolatedString = false;
  this->shouldParseOutString = false;
  pFVar1 = fopen(filepath,"r");
  this->file = (FILE *)pFVar1;
  if (this->file == (FILE *)0x0) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = "Could not open file!";
    __cxa_throw(puVar2,&char_const*::typeinfo,0);
  }
  initLexToTokenTable(this);
  nextChar(this);
  return;
}

Assistant:

Klex::Klex(const char* filepath) {
    file = fopen(filepath, "r");
    if(!file)
        throw "Could not open file!";
    initLexToTokenTable();

    nextChar();
}